

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxFacts.cpp
# Opt level: O2

SyntaxKind slang::syntax::SyntaxFacts::getModuleHeaderKind(TokenKind kind)

{
  SyntaxKind SVar1;
  undefined2 in_register_0000003a;
  int iVar2;
  
  iVar2 = CONCAT22(in_register_0000003a,kind);
  if (iVar2 == 200) {
    return InterfaceHeader;
  }
  SVar1 = ModuleHeader;
  if ((iVar2 != 0xd5) && (iVar2 != 0xd9)) {
    if (iVar2 == 0xe8) {
      return PackageHeader;
    }
    if (iVar2 == 0xef) {
      return ProgramHeader;
    }
    SVar1 = Unknown;
  }
  return SVar1;
}

Assistant:

SyntaxKind SyntaxFacts::getModuleHeaderKind(TokenKind kind) {
    switch (kind) {
        case TokenKind::ModuleKeyword: return SyntaxKind::ModuleHeader;
        case TokenKind::MacromoduleKeyword: return SyntaxKind::ModuleHeader;
        case TokenKind::ProgramKeyword: return SyntaxKind::ProgramHeader;
        case TokenKind::InterfaceKeyword: return SyntaxKind::InterfaceHeader;
        case TokenKind::PackageKeyword: return SyntaxKind::PackageHeader;
        default: return SyntaxKind::Unknown;
    }
}